

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O0

void __thiscall UnitTest_table2::UnitTest_table2(UnitTest_table2 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_0026a6c8;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"table2");
  return;
}

Assistant:

TEST_CASE(table2)
{
    luna::Table t;
    luna::String key_str("key");
    luna::String value_str("value");

    luna::Value key;
    luna::Value value;

    key.type_ = luna::ValueT_Obj;
    key.obj_ = &key_str;
    value.type_ = luna::ValueT_Obj;
    value.obj_ = &value_str;

    t.SetValue(key, value);
    value = t.GetValue(key);

    EXPECT_TRUE(value.type_ == luna::ValueT_Obj);
    EXPECT_TRUE(value.obj_ == &value_str);

    luna::Value key_not_existed;
    key_not_existed.type_ = luna::ValueT_Obj;
    key_not_existed.obj_ = &value_str;

    value = t.GetValue(key_not_existed);
    EXPECT_TRUE(value.type_ == luna::ValueT_Nil);

    EXPECT_TRUE(t.FirstKeyValue(key, value));
    EXPECT_TRUE(key.obj_ == &key_str);
    EXPECT_TRUE(value.obj_ == &value_str);

    EXPECT_TRUE(!t.NextKeyValue(key, key, value));
}